

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O1

void __thiscall
QAbstractItemModelTesterPrivate::layoutChanged(QAbstractItemModelTesterPrivate *this)

{
  Data *pDVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pQVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QPersistentModelIndex p;
  QObject *local_a8;
  QModelIndex local_88;
  undefined1 local_70 [24];
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.r = 4;
  bVar3 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)&local_58,"changeInFlight",
                     "ChangeInFlight::LayoutChanged",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x393);
  if (bVar3) {
    this->changeInFlight = None;
    bVar3 = (this->changing).d.size != 0;
    if (bVar3) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar7 = QList<QPersistentModelIndex>::data(&this->changing);
        QPersistentModelIndex::QPersistentModelIndex
                  (&local_40,(QPersistentModelIndex *)((long)&pQVar7->d + lVar8));
        pDVar1 = (this->model).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          local_a8 = (QObject *)0x0;
        }
        else {
          local_a8 = (this->model).wp.value;
        }
        uVar5 = QPersistentModelIndex::row();
        uVar6 = QPersistentModelIndex::column();
        QPersistentModelIndex::parent();
        (**(code **)(*(long *)local_a8 + 0x60))(&local_58,local_a8,uVar5,uVar6,local_70);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&local_40);
        bVar4 = compare<QModelIndex,QModelIndex>
                          (this,&local_58,&local_88,"model->index(p.row(), p.column(), p.parent())",
                           "QModelIndex(p)",
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x398);
        QPersistentModelIndex::~QPersistentModelIndex(&local_40);
        if (!bVar4) {
          if (bVar3) goto LAB_0014c29b;
          break;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 8;
        uVar2 = (this->changing).d.size;
        bVar3 = uVar9 < uVar2;
      } while (uVar9 < uVar2);
    }
    QList<QPersistentModelIndex>::clear(&this->changing);
  }
LAB_0014c29b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::LayoutChanged);
    changeInFlight = ChangeInFlight::None;

    for (int i = 0; i < changing.size(); ++i) {
        QPersistentModelIndex p = changing[i];
        MODELTESTER_COMPARE(model->index(p.row(), p.column(), p.parent()), QModelIndex(p));
    }
    changing.clear();
}